

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_frame.c
# Opt level: O1

size_t nghttp3_frame_write_settings_len(int64_t *ppayloadlen,nghttp3_frame_settings *fr)

{
  size_t sVar1;
  size_t sVar2;
  uint64_t *puVar3;
  ulong uVar4;
  long n;
  
  if (fr->niv == 0) {
    n = 0;
  }
  else {
    puVar3 = &fr->iv[0].value;
    uVar4 = 0;
    n = 0;
    do {
      sVar1 = nghttp3_put_varintlen(((nghttp3_settings_entry *)(puVar3 + -1))->id);
      sVar2 = nghttp3_put_varintlen(*puVar3);
      n = sVar1 + n + sVar2;
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 2;
    } while (uVar4 < fr->niv);
  }
  *ppayloadlen = n;
  sVar1 = nghttp3_put_varintlen(4);
  sVar2 = nghttp3_put_varintlen(n);
  return sVar2 + sVar1 + n;
}

Assistant:

size_t nghttp3_frame_write_settings_len(int64_t *ppayloadlen,
                                        const nghttp3_frame_settings *fr) {
  size_t payloadlen = 0;
  size_t i;

  for (i = 0; i < fr->niv; ++i) {
    payloadlen += nghttp3_put_varintlen((int64_t)fr->iv[i].id) +
                  nghttp3_put_varintlen((int64_t)fr->iv[i].value);
  }

  *ppayloadlen = (int64_t)payloadlen;

  return nghttp3_put_varintlen(NGHTTP3_FRAME_SETTINGS) +
         nghttp3_put_varintlen((int64_t)payloadlen) + payloadlen;
}